

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout.cpp
# Opt level: O1

QSizeF __thiscall
QGraphicsAnchorLayout::sizeHint(QGraphicsAnchorLayout *this,SizeHint which,QSizeF *constraint)

{
  double dVar1;
  double dVar2;
  QGraphicsAnchorLayoutPrivate *this_00;
  long in_FS_OFFSET;
  QSizeF QVar3;
  qreal bottom;
  qreal right;
  qreal top;
  qreal left;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QGraphicsAnchorLayoutPrivate *)
            (this->super_QGraphicsLayout).super_QGraphicsLayoutItem.d_ptr.d;
  QGraphicsAnchorLayoutPrivate::calculateGraphs(this_00);
  if (which < MinimumDescent) {
    dVar1 = (this_00->sizeHints).m_data[0]._M_elems[which];
    dVar2 = *(double *)((long)(&this_00->graph + -4) + ((ulong)which + 1) * 8);
    local_40 = -NAN;
    local_48 = -NAN;
    local_50 = -NAN;
    local_58 = -NAN;
    (*(this->super_QGraphicsLayout).super_QGraphicsLayoutItem._vptr_QGraphicsLayoutItem[3])
              (this,&local_40,&local_48,&local_50,&local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QVar3.wd = dVar1 + local_40 + local_50;
      QVar3.ht = dVar2 + local_48 + local_58;
      return QVar3;
    }
  }
  else {
    sizeHint();
  }
  __stack_chk_fail();
}

Assistant:

QSizeF QGraphicsAnchorLayout::sizeHint(Qt::SizeHint which, const QSizeF &constraint) const
{
    Q_UNUSED(constraint);
    Q_D(const QGraphicsAnchorLayout);

    // Some setup calculations are delayed until the information is
    // actually needed, avoiding unnecessary recalculations when
    // adding multiple anchors.

    // sizeHint() / effectiveSizeHint() already have a cache
    // mechanism, using invalidate() to force recalculation. However
    // sizeHint() is called three times after invalidation (for max,
    // min and pref), but we just need do our setup once.

    const_cast<QGraphicsAnchorLayoutPrivate *>(d)->calculateGraphs();

    // ### apply constraint!
    QSizeF engineSizeHint{d->sizeHints[Qt::Horizontal][which],
                          d->sizeHints[Qt::Vertical][which]};

    qreal left, top, right, bottom;
    getContentsMargins(&left, &top, &right, &bottom);

    return engineSizeHint + QSizeF(left + right, top + bottom);
}